

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_internal.h
# Opt level: O0

void __thiscall
ctemplate::ModifierInfo::ModifierInfo
          (ModifierInfo *this,string *ln,char sn,XssClass xc,TemplateModifier *m)

{
  char *pcVar1;
  TemplateModifier *local_48;
  TemplateModifier *m_local;
  XssClass xc_local;
  char sn_local;
  string *ln_local;
  ModifierInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)ln);
  this->short_name = sn;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strchr(pcVar1,0x3d);
  this->modval_required = pcVar1 != (char *)0x0;
  this->is_registered = m != (TemplateModifier *)0x0;
  this->xss_class = xc;
  local_48 = m;
  if (m == (TemplateModifier *)0x0) {
    local_48 = (TemplateModifier *)&null_modifier;
  }
  this->modifier = local_48;
  return;
}

Assistant:

ModifierInfo(string ln, char sn, XssClass xc, const TemplateModifier* m)
      : long_name(ln), short_name(sn),
        modval_required(strchr(ln.c_str(), '=') != NULL),
        is_registered(m != NULL), xss_class(xc),
        modifier(m ? m : &null_modifier) { }